

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMaxLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta_00;
  undefined1 in_stack_fffffffffffffeb8 [24];
  Status *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffeb8,this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pVVar1 = this->theLbound;
  pUVar2 = this->thePvec;
  pVVar3 = this->theUbound;
  epsilon(&local_68,this);
  leavetol(&local_d8,this);
  p_delta.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.stat)->data;
  p_delta.m_backend.data._M_elems._0_8_ = &local_d8;
  p_delta.m_backend.data._M_elems[4] = 0;
  p_delta.m_backend.data._M_elems[5] = 0;
  p_delta.m_backend.data._M_elems[6] = 1;
  p_delta.m_backend.data._M_elems[7] = 0;
  p_delta.m_backend.data._M_elems[8] = in_stack_fffffffffffffeb8._0_4_;
  p_delta.m_backend.data._M_elems[9] = in_stack_fffffffffffffeb8._4_4_;
  p_delta.m_backend.exp = in_stack_fffffffffffffeb8._8_4_;
  p_delta.m_backend.neg = (bool)in_stack_fffffffffffffeb8[0xc];
  p_delta.m_backend._45_3_ = in_stack_fffffffffffffeb8._13_3_;
  p_delta.m_backend.fpclass = in_stack_fffffffffffffeb8._16_4_;
  p_delta.m_backend.prec_elem = in_stack_fffffffffffffeb8._20_4_;
  perturbMax((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffeb8,this,pUVar2,pVVar1,pVVar3,&local_68,p_delta,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffeb8);
  pVVar1 = this->theCoLbound;
  pUVar2 = this->theCoPvec;
  pVVar3 = this->theCoUbound;
  epsilon(&local_a0,this);
  leavetol(&local_110,this);
  p_delta_00.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.costat)->data;
  p_delta_00.m_backend.data._M_elems._0_8_ = &local_110;
  p_delta_00.m_backend.data._M_elems[4] = 0;
  p_delta_00.m_backend.data._M_elems[5] = 0;
  p_delta_00.m_backend.data._M_elems[6] = 1;
  p_delta_00.m_backend.data._M_elems[7] = 0;
  p_delta_00.m_backend.data._M_elems[8] = in_stack_fffffffffffffeb8._0_4_;
  p_delta_00.m_backend.data._M_elems[9] = in_stack_fffffffffffffeb8._4_4_;
  p_delta_00.m_backend.exp = in_stack_fffffffffffffeb8._8_4_;
  p_delta_00.m_backend.neg = (bool)in_stack_fffffffffffffeb8[0xc];
  p_delta_00.m_backend._45_3_ = in_stack_fffffffffffffeb8._13_3_;
  p_delta_00.m_backend.fpclass = in_stack_fffffffffffffeb8._16_4_;
  p_delta_00.m_backend.prec_elem = in_stack_fffffffffffffeb8._20_4_;
  perturbMax((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffeb8,this,pUVar2,pVVar1,pVVar3,&local_a0,p_delta_00,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffeb8);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffeb8,this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMaxLeave(void)
{
   SPxOut::debug(this, "DSHIFT06 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMax(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMax(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}